

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  Parse *in_RDX;
  Select *in_RSI;
  Parse *in_RDI;
  
  if ((((in_RDI->db->mallocFailed == '\0') && ((in_RSI->selFlags & 0x80) == 0)) &&
      (sqlite3SelectExpand(in_RDX,(Select *)0x1dd035), in_RDI->nErr == 0)) &&
     (sqlite3ResolveSelectNames(in_RDI,in_RSI,(NameContext *)in_RDX), in_RDI->nErr == 0)) {
    sqlite3SelectAddTypeInfo(in_RDX,(Select *)0x1dd071);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  assert( p!=0 || pParse->db->mallocFailed );
  assert( pParse->db->pParse==pParse );
  if( pParse->db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}